

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O0

void __thiscall
bidfx_public_api::price::pixie::SubjectSetRegisterTest_test_unsub_and_sub_supercedes_refresh_Test::
SubjectSetRegisterTest_test_unsub_and_sub_supercedes_refresh_Test
          (SubjectSetRegisterTest_test_unsub_and_sub_supercedes_refresh_Test *this)

{
  SubjectSetRegisterTest_test_unsub_and_sub_supercedes_refresh_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)
       &PTR__SubjectSetRegisterTest_test_unsub_and_sub_supercedes_refresh_Test_003db708;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_unsub_and_sub_supercedes_refresh)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    subject_register.Register(SS_RFQ_SUBJECT3, false);
    std::vector<Subject> subjects_set = {SS_RFQ_SUBJECT3};
    EXPECT_EQ(subjects_set, subject_register.NextSubscriptionSync()->GetSubjects());

    subject_register.Register(SS_RFQ_SUBJECT3, true);
    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, false);

    std::optional<SubscriptionSync> message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message->IsChangedEdition());

    subject_register.Unregister(SS_RFQ_SUBJECT3);
    subject_register.Register(SS_RFQ_SUBJECT3, true);

    message = subject_register.NextSubscriptionSync();
    EXPECT_FALSE(message->IsChangedEdition());
    std::map<uint32_t, ControlOperationEnum> control_set = {{0, ControlOperationEnum::TOGGLE}};
    EXPECT_EQ(control_set, message->GetControls());
}